

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O1

void aom_int_pro_row_c(int16_t *hbuf,uint8_t *ref,int ref_stride,int width,int height,
                      int norm_factor)

{
  short sVar1;
  ulong uVar2;
  ulong uVar3;
  byte *pbVar4;
  
  if (0 < width) {
    uVar3 = 0;
    do {
      hbuf[uVar3] = 0;
      if (0 < height) {
        sVar1 = hbuf[uVar3];
        uVar2 = (ulong)(uint)height;
        pbVar4 = ref;
        do {
          sVar1 = sVar1 + (ushort)*pbVar4;
          hbuf[uVar3] = sVar1;
          pbVar4 = pbVar4 + ref_stride;
          uVar2 = uVar2 - 1;
        } while (uVar2 != 0);
      }
      hbuf[uVar3] = (int16_t)((int)hbuf[uVar3] >> ((byte)norm_factor & 0x1f));
      ref = ref + 1;
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)width);
  }
  return;
}

Assistant:

void aom_int_pro_row_c(int16_t *hbuf, const uint8_t *ref, const int ref_stride,
                       const int width, const int height, int norm_factor) {
  assert(height >= 2);
  for (int idx = 0; idx < width; ++idx) {
    hbuf[idx] = 0;
    // hbuf[idx]: 14 bit, dynamic range [0, 32640].
    for (int i = 0; i < height; ++i) hbuf[idx] += ref[i * ref_stride];
    // hbuf[idx]: 9 bit, dynamic range [0, 1020].
    hbuf[idx] >>= norm_factor;
    ++ref;
  }
}